

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall SwitchStatement::Action(SwitchStatement *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  undefined4 uVar3;
  SymbolType expression_type;
  
  uVar3 = 0;
LAB_00139c56:
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  switch(uVar3) {
  case 0:
    uVar3 = 1;
    if (SVar1 != SWITCH_SYM) {
      return -1;
    }
    break;
  case 1:
    uVar3 = 2;
    if (SVar1 != L_CIRCLE_BRACKET_SYM) {
      return -1;
    }
    break;
  case 2:
    cVar2 = Expression::Action(&this->m_expression,&expression_type);
    if (cVar2 != 0) {
      return -1;
    }
    Expression::LogOutput(&this->m_expression);
    uVar3 = 3;
    goto LAB_00139c56;
  case 3:
    uVar3 = 4;
    if (SVar1 != R_CIRCLE_BRACKET_SYM) {
      return -1;
    }
    break;
  case 4:
    uVar3 = 5;
    if (SVar1 != L_CURLY_BRACKET_SYM) {
      return -1;
    }
    break;
  case 5:
    cVar2 = SwitchTable::Action(&this->m_switch_table,&expression_type);
    if (cVar2 != 0) {
      return -1;
    }
    SwitchTable::LogOutput(&this->m_switch_table);
    uVar3 = 6;
    goto LAB_00139c56;
  case 6:
    cVar2 = Default::Action(&this->m_default);
    if (cVar2 != 0) goto switchD_00139c74_caseD_7;
    Default::LogOutput(&this->m_default);
    uVar3 = 7;
    goto LAB_00139c56;
  case 7:
switchD_00139c74_caseD_7:
    uVar3 = 8;
    if (SVar1 != R_CURLY_BRACKET_SYM) {
      return -1;
    }
    break;
  case 8:
    goto LAB_00139d23;
  }
  SymbolQueue::NextSymbol(handle_correct_queue);
  goto LAB_00139c56;
LAB_00139d23:
  return 0;
}

Assistant:

compile_errcode SwitchStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == SWITCH_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    m_expression.LogOutput();
                    state = 3;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 4: {
                if (name == L_CURLY_BRACKET_SYM) {
                    state = 5;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 5: {
                if ((ret = m_switch_table.Action(expression_type)) == COMPILE_OK) {
                    m_switch_table.LogOutput();
                    state = 6;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 6: {
                if ((ret = m_default.Action()) == COMPILE_OK) {
                    m_default.LogOutput();
                    state = 7;
                    break;
                } else if (name == R_CURLY_BRACKET_SYM) {
                    state = 8;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 7: {
                if (name == R_CURLY_BRACKET_SYM) {
                    state = 8;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 8: return COMPILE_OK;
        }
        if (state != 3 && state != 6 && state != 7)
            handle_correct_queue->NextSymbol();
    }
    ERROR_SWITCH:
       return NOT_MATCH;
}